

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O2

void __thiscall
msgpack11::Value<(msgpack11::MsgPack::Type)4,_short>::dump
          (Value<(msgpack11::MsgPack::Type)4,_short> *this,string *out)

{
  char cVar1;
  long lVar2;
  
  cVar1 = (char)out;
  std::__cxx11::string::push_back(cVar1);
  if ((anonymous_namespace)::is_big_endian == '\x01') {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      std::__cxx11::string::push_back(cVar1);
    }
  }
  else {
    for (lVar2 = 2; lVar2 != 0; lVar2 = lVar2 + -1) {
      std::__cxx11::string::push_back(cVar1);
    }
  }
  return;
}

Assistant:

void dump(std::string &out) const override { msgpack11::dump(m_value, out); }